

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# INTEGER.c
# Opt level: O0

asn_dec_rval_t
INTEGER_decode_uper(asn_codec_ctx_t *opt_codec_ctx,asn_TYPE_descriptor_t *td,
                   asn_per_constraints_t *constraints,void **sptr,asn_per_data_t *pd)

{
  long lVar1;
  int32_t iVar2;
  int iVar3;
  long *plVar4;
  void *pvVar5;
  ssize_t sVar6;
  undefined8 *in_RCX;
  uint *in_RDX;
  undefined8 *in_RSI;
  asn_dec_rval_t aVar7;
  long value;
  int ret;
  void *p;
  ssize_t len;
  unsigned_long svalue;
  unsigned_long uvalue;
  size_t size;
  int inext;
  int repeat;
  asn_per_constraint_t *ct;
  INTEGER_t *st;
  asn_dec_rval_t rval;
  asn_INTEGER_specifics_t *specs;
  asn_dec_rval_t tmp_error;
  int in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  uint8_t *in_stack_ffffffffffffff10;
  asn_per_data_t *in_stack_ffffffffffffff18;
  unsigned_long *in_stack_ffffffffffffff20;
  asn_per_data_t *in_stack_ffffffffffffff28;
  long *in_stack_ffffffffffffff30;
  INTEGER_t *in_stack_ffffffffffffff38;
  long in_stack_ffffffffffffff40;
  INTEGER_t *in_stack_ffffffffffffff48;
  char *pcVar8;
  uint *local_b0;
  char *local_a8;
  undefined8 local_80;
  undefined8 local_78;
  int local_64;
  uint *local_60;
  asn_per_data_t *in_stack_ffffffffffffffb0;
  size_t local_48;
  uint *local_28;
  asn_per_data_t *local_10;
  size_t local_8;
  
  lVar1 = in_RSI[0x13];
  memset(&stack0xffffffffffffffb0,0,0x10);
  plVar4 = (long *)*in_RCX;
  if (plVar4 == (long *)0x0) {
    plVar4 = (long *)calloc(1,0x10);
    *in_RCX = plVar4;
    if (plVar4 == (long *)0x0) {
      local_10 = (asn_per_data_t *)0x2;
      local_8 = 0;
      if (in_RSI == (undefined8 *)0x0) {
        local_a8 = "";
      }
      else {
        local_a8 = (char *)*in_RSI;
      }
      ASN_DEBUG("Failed to decode element %s",local_a8);
      goto LAB_0014fbdb;
    }
  }
  local_28 = in_RDX;
  if (in_RDX == (uint *)0x0) {
    local_28 = (uint *)in_RSI[0x10];
  }
  if (local_28 == (uint *)0x0) {
    local_b0 = (uint *)0x0;
  }
  else {
    local_b0 = local_28;
  }
  local_60 = local_b0;
  if ((local_b0 != (uint *)0x0) && ((*local_b0 & 4) != 0)) {
    iVar2 = per_get_few_bits(in_stack_ffffffffffffffb0,(int)((ulong)plVar4 >> 0x20));
    if (iVar2 < 0) {
      local_10 = (asn_per_data_t *)0x1;
      local_8 = 0;
      goto LAB_0014fbdb;
    }
    if (iVar2 != 0) {
      local_60 = (uint *)0x0;
    }
  }
  free((void *)*plVar4);
  *plVar4 = 0;
  *(undefined4 *)(plVar4 + 1) = 0;
  if (local_60 != (uint *)0x0) {
    if ((*local_60 & 1) == 0) {
      if (((*local_60 & 2) != 0) && (-1 < (int)local_60[1])) {
        iVar3 = (int)(local_60[1] + 7) >> 3;
        pvVar5 = malloc((long)iVar3 + 2);
        *plVar4 = (long)pvVar5;
        if (*plVar4 == 0) {
          local_10 = (asn_per_data_t *)0x2;
          local_8 = 0;
          if (in_RSI == (undefined8 *)0x0) {
            pcVar8 = "";
          }
          else {
            pcVar8 = (char *)*in_RSI;
          }
          ASN_DEBUG("Failed to decode element %s",pcVar8);
          goto LAB_0014fbdb;
        }
        *(int *)(plVar4 + 1) = iVar3;
      }
    }
    else {
      pvVar5 = calloc(1,2);
      *plVar4 = (long)pvVar5;
      if (*plVar4 == 0) {
        local_10 = (asn_per_data_t *)0x2;
        local_8 = 0;
        if (in_RSI == (undefined8 *)0x0) {
          pcVar8 = "";
        }
        else {
          pcVar8 = (char *)*in_RSI;
        }
        ASN_DEBUG("Failed to decode element %s",pcVar8);
        goto LAB_0014fbdb;
      }
      *(undefined4 *)(plVar4 + 1) = 1;
    }
  }
  if ((local_60 == (uint *)0x0) || (*local_60 == 0)) {
    ASN_DEBUG("Decoding unconstrained integer %s",*in_RSI);
  }
  else {
    ASN_DEBUG("Integer with range %d bits",(ulong)local_60[1]);
    if (-1 < (int)local_60[1]) {
      if (0x40 < local_60[1]) {
        local_10 = (asn_per_data_t *)0x2;
        local_8 = 0;
        if (in_RSI == (undefined8 *)0x0) {
          pcVar8 = "";
        }
        else {
          pcVar8 = (char *)*in_RSI;
        }
        ASN_DEBUG("Failed to decode element %s",pcVar8);
        goto LAB_0014fbdb;
      }
      iVar3 = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
      if ((lVar1 == 0) || (*(int *)(lVar1 + 0x20) == 0)) {
        iVar3 = uper_get_constrained_whole_number
                          (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,iVar3);
        if (iVar3 != 0) {
          local_10 = (asn_per_data_t *)0x1;
          local_8 = 0;
          goto LAB_0014fbdb;
        }
        ASN_DEBUG("Got value %ld + low %ld",local_80,*(undefined8 *)(local_60 + 4));
        iVar3 = asn_long2INTEGER(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
        if (iVar3 != 0) {
          local_10 = (asn_per_data_t *)0x2;
          local_8 = 0;
          if (in_RSI == (undefined8 *)0x0) {
            pcVar8 = "";
          }
          else {
            pcVar8 = (char *)*in_RSI;
          }
          ASN_DEBUG("Failed to decode element %s",pcVar8);
          goto LAB_0014fbdb;
        }
      }
      else {
        iVar3 = uper_get_constrained_whole_number
                          (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,iVar3);
        if (iVar3 != 0) {
          local_10 = (asn_per_data_t *)0x1;
          local_8 = 0;
          goto LAB_0014fbdb;
        }
        ASN_DEBUG("Got value %lu + low %ld",local_78,*(undefined8 *)(local_60 + 4));
        iVar3 = asn_ulong2INTEGER((INTEGER_t *)in_stack_ffffffffffffff28,
                                  (unsigned_long)in_stack_ffffffffffffff20);
        if (iVar3 != 0) {
          local_10 = (asn_per_data_t *)0x2;
          local_8 = 0;
          if (in_RSI == (undefined8 *)0x0) {
            pcVar8 = "";
          }
          else {
            pcVar8 = (char *)*in_RSI;
          }
          ASN_DEBUG("Failed to decode element %s",pcVar8);
          goto LAB_0014fbdb;
        }
      }
      local_8 = local_48;
      local_10 = in_stack_ffffffffffffffb0;
      goto LAB_0014fbdb;
    }
  }
  do {
    sVar6 = uper_get_length(in_stack_ffffffffffffff28,
                            (int)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                            (int *)in_stack_ffffffffffffff18);
    if (sVar6 < 0) {
      local_10 = (asn_per_data_t *)0x1;
      local_8 = 0;
      goto LAB_0014fbdb;
    }
    pvVar5 = realloc((void *)*plVar4,(int)plVar4[1] + sVar6 + 1);
    if (pvVar5 == (void *)0x0) {
      local_10 = (asn_per_data_t *)0x2;
      local_8 = 0;
      if (in_RSI == (undefined8 *)0x0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = (char *)*in_RSI;
      }
      ASN_DEBUG("Failed to decode element %s",pcVar8);
      goto LAB_0014fbdb;
    }
    *plVar4 = (long)pvVar5;
    iVar3 = per_get_many_bits(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                              in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08);
    if (iVar3 < 0) {
      local_10 = (asn_per_data_t *)0x1;
      local_8 = 0;
      goto LAB_0014fbdb;
    }
    *(int *)(plVar4 + 1) = (int)plVar4[1] + (int)sVar6;
  } while (local_64 != 0);
  *(undefined1 *)(*plVar4 + (long)(int)plVar4[1]) = 0;
  if ((local_60 != (uint *)0x0) && (*(long *)(local_60 + 4) != 0)) {
    iVar3 = asn_INTEGER2long(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    if (iVar3 != 0) {
      local_10 = (asn_per_data_t *)0x2;
      local_8 = 0;
      if (in_RSI == (undefined8 *)0x0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = (char *)*in_RSI;
      }
      ASN_DEBUG("Failed to decode element %s",pcVar8);
      goto LAB_0014fbdb;
    }
    iVar3 = asn_long2INTEGER(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    if (iVar3 != 0) {
      local_10 = (asn_per_data_t *)0x2;
      local_8 = 0;
      if (in_RSI == (undefined8 *)0x0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = (char *)*in_RSI;
      }
      ASN_DEBUG("Failed to decode element %s",pcVar8);
      goto LAB_0014fbdb;
    }
  }
  local_8 = local_48;
  local_10 = in_stack_ffffffffffffffb0;
LAB_0014fbdb:
  aVar7._0_8_ = (ulong)local_10 & 0xffffffff;
  aVar7.consumed = local_8;
  return aVar7;
}

Assistant:

asn_dec_rval_t
INTEGER_decode_uper(asn_codec_ctx_t *opt_codec_ctx, asn_TYPE_descriptor_t *td,
	asn_per_constraints_t *constraints, void **sptr, asn_per_data_t *pd) {
	asn_INTEGER_specifics_t *specs=(asn_INTEGER_specifics_t *)td->specifics;
	asn_dec_rval_t rval = { RC_OK, 0 };
	INTEGER_t *st = (INTEGER_t *)*sptr;
	asn_per_constraint_t *ct;
	int repeat;

	(void)opt_codec_ctx;

	if(!st) {
		st = (INTEGER_t *)(*sptr = CALLOC(1, sizeof(*st)));
		if(!st) ASN__DECODE_FAILED;
	}

	if(!constraints) constraints = td->per_constraints;
	ct = constraints ? &constraints->value : 0;

	if(ct && ct->flags & APC_EXTENSIBLE) {
		int inext = per_get_few_bits(pd, 1);
		if(inext < 0) ASN__DECODE_STARVED;
		if(inext) ct = 0;
	}

	FREEMEM(st->buf);
	st->buf = 0;
	st->size = 0;
	if(ct) {
		if(ct->flags & APC_SEMI_CONSTRAINED) {
			st->buf = (uint8_t *)CALLOC(1, 2);
			if(!st->buf) ASN__DECODE_FAILED;
			st->size = 1;
		} else if(ct->flags & APC_CONSTRAINED && ct->range_bits >= 0) {
			size_t size = (ct->range_bits + 7) >> 3;
			st->buf = (uint8_t *)MALLOC(1 + size + 1);
			if(!st->buf) ASN__DECODE_FAILED;
			st->size = size;
		}
	}

	/* X.691-2008/11, #13.2.2, constrained whole number */
	if(ct && ct->flags != APC_UNCONSTRAINED) {
		/* #11.5.6 */
		ASN_DEBUG("Integer with range %d bits", ct->range_bits);
		if(ct->range_bits >= 0) {
			if((size_t)ct->range_bits > 8 * sizeof(unsigned long))
				ASN__DECODE_FAILED;

			if(specs && specs->field_unsigned) {
				unsigned long uvalue;
				if(uper_get_constrained_whole_number(pd,
					&uvalue, ct->range_bits))
					ASN__DECODE_STARVED;
				ASN_DEBUG("Got value %lu + low %ld",
					uvalue, ct->lower_bound);
				uvalue += ct->lower_bound;
				if(asn_ulong2INTEGER(st, uvalue))
					ASN__DECODE_FAILED;
			} else {
				unsigned long svalue;
				if(uper_get_constrained_whole_number(pd,
					&svalue, ct->range_bits))
					ASN__DECODE_STARVED;
				ASN_DEBUG("Got value %ld + low %ld",
					svalue, ct->lower_bound);
				svalue += ct->lower_bound;
				if(asn_long2INTEGER(st, svalue))
					ASN__DECODE_FAILED;
			}
			return rval;
		}
	} else {
		ASN_DEBUG("Decoding unconstrained integer %s", td->name);
	}

	/* X.691, #12.2.3, #12.2.4 */
	do {
		ssize_t len;
		void *p;
		int ret;

		/* Get the PER length */
		len = uper_get_length(pd, -1, &repeat);
		if(len < 0) ASN__DECODE_STARVED;

		p = REALLOC(st->buf, st->size + len + 1);
		if(!p) ASN__DECODE_FAILED;
		st->buf = (uint8_t *)p;

		ret = per_get_many_bits(pd, &st->buf[st->size], 0, 8 * len);
		if(ret < 0) ASN__DECODE_STARVED;
		st->size += len;
	} while(repeat);
	st->buf[st->size] = 0;	/* JIC */

	/* #12.2.3 */
	if(ct && ct->lower_bound) {
		/*
		 * TODO: replace by in-place arithmetics.
		 */
		long value;
		if(asn_INTEGER2long(st, &value))
			ASN__DECODE_FAILED;
		if(asn_long2INTEGER(st, value + ct->lower_bound))
			ASN__DECODE_FAILED;
	}

	return rval;
}